

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.cpp
# Opt level: O1

void __thiscall
iu_AssertionTest_x_iutest_x_Near_Test::Body(iu_AssertionTest_x_iutest_x_Near_Test *this)

{
  AssertionResult iutest_ar;
  int *val2;
  float in_stack_fffffffffffffe00;
  float val1;
  _Alloc_hider in_stack_fffffffffffffe08;
  char *in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  bool local_1d8;
  AssertionHelper local_1d0;
  undefined1 local_1a0 [392];
  
  local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 0;
  val1 = 1.4013e-45;
  val2 = (int *)local_1a0;
  local_1a0._0_8_ = 0x3ff8000000000000;
  iutest::internal::CmpHelperNear<int,double>
            ((AssertionResult *)&stack0xfffffffffffffe08,(internal *)0x32f9df,"1","1.5",
             (char *)&local_1d0,(int *)&stack0xfffffffffffffe04,val2,
             (double *)CONCAT44(1,in_stack_fffffffffffffe00));
  if (local_1d8 == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,in_stack_fffffffffffffe08._M_p,
               (allocator<char> *)&stack0xfffffffffffffe04);
    local_1d0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
    ;
    local_1d0.m_part_result.super_iuCodeMessage.m_line = 0xf4;
    local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_) !=
        &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._0_4_),
                      local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
  }
  if (in_stack_fffffffffffffe08._M_p != &stack0xfffffffffffffe18) {
    operator_delete(in_stack_fffffffffffffe08._M_p,(ulong)(in_stack_fffffffffffffe18 + 1));
  }
  if (local_1d8 != false) {
    iutest::internal::CmpHelperNearFloatingPoint<float>
              ((char *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
               in_stack_fffffffffffffe08._M_p,val1,in_stack_fffffffffffffe00,
               (float)((ulong)val2 >> 0x20));
    if (local_1d8 == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,in_stack_fffffffffffffe08._M_p,
                 (allocator<char> *)&stack0xfffffffffffffe04);
      local_1d0.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
      ;
      local_1d0.m_part_result.super_iuCodeMessage.m_line = 0xf5;
      local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_)
          != &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._0_4_),
                        local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    if (in_stack_fffffffffffffe08._M_p != &stack0xfffffffffffffe18) {
      operator_delete(in_stack_fffffffffffffe08._M_p,(ulong)(in_stack_fffffffffffffe18 + 1));
    }
    iutest::internal::CmpHelperNearFloatingPoint<double>
              ((char *)in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,
               in_stack_fffffffffffffe10,(double)in_stack_fffffffffffffe08._M_p,
               (double)CONCAT44(val1,in_stack_fffffffffffffe00),(double)val2);
    if (local_1d8 == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,in_stack_fffffffffffffe08._M_p,
                 (allocator<char> *)&stack0xfffffffffffffe04);
      local_1d0.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
      ;
      local_1d0.m_part_result.super_iuCodeMessage.m_line = 0xf6;
      local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
      iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_)
          != &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._0_4_),
                        local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    if (in_stack_fffffffffffffe08._M_p != &stack0xfffffffffffffe18) {
      operator_delete(in_stack_fffffffffffffe08._M_p,(ulong)(in_stack_fffffffffffffe18 + 1));
    }
  }
  return;
}

Assistant:

IUTEST(AssertionTest, Near)
{
    IUTEST_ASSERT_NEAR(0, 1, 1.5);
    IUTEST_EXPECT_NEAR(1.0f, 4.0f, 3);
    IUTEST_INFORM_NEAR(2.0, 1.0, 2);
}